

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::createForModport
          (Scope *scope,SyntaxNode *syntax,Token nameToken,bool isExport)

{
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  MethodPrototypeSymbol *this;
  Symbol *pSVar2;
  Type *pTVar3;
  undefined8 in_RCX;
  SourceLocation in_RDX;
  Scope *in_RSI;
  SourceLocation in_RDI;
  byte in_R8B;
  Diagnostic *diag_1;
  Diagnostic *diag;
  Symbol *target;
  MethodPrototypeSymbol *result;
  string_view name;
  MethodFlags flags;
  Compilation *comp;
  SubroutineSymbol **__t;
  optional<const_slang::ast::SubroutineSymbol_*> *in_stack_fffffffffffffea0;
  SourceLocation in_stack_fffffffffffffea8;
  DeclaredType *pDVar4;
  Token *in_stack_fffffffffffffeb0;
  DiagCode noteCode;
  Token *in_stack_fffffffffffffec0;
  Visibility *in_stack_fffffffffffffed8;
  Diagnostic *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  SyntaxNode *in_stack_fffffffffffffef0;
  Compilation *in_stack_fffffffffffffef8;
  string_view in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  _Storage<const_slang::ast::SubroutineSymbol_*,_true> local_d8;
  undefined8 local_d0;
  string_view local_50;
  undefined2 local_3a;
  Compilation *local_38;
  byte local_29;
  SourceLocation SVar5;
  DiagCode code;
  
  code = SUB84((ulong)in_RCX >> 0x20,0);
  local_29 = in_R8B & 1;
  local_38 = Scope::getCompilation((Scope *)in_RDI);
  local_3a = 0x20;
  if ((local_29 & 1) != 0) {
    local_3a = 0x40;
  }
  local_50 = parsing::Token::valueText(in_stack_fffffffffffffeb0);
  noteCode = SUB84((ulong)in_stack_fffffffffffffeb0 >> 0x20,0);
  parsing::Token::location((Token *)&stack0xffffffffffffffe8);
  __t = (SubroutineSymbol **)&local_3a;
  this = BumpAllocator::
         emplace<slang::ast::MethodPrototypeSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::SubroutineKind,slang::ast::Visibility,slang::ast::MethodFlags&>
                   ((BumpAllocator *)in_stack_ffffffffffffff00._M_len,in_stack_fffffffffffffef8,
                    (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
                    (SourceLocation *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                    (SubroutineKind *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                    (MethodFlags *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  Symbol::setSyntax(&this->super_Symbol,(SyntaxNode *)in_RSI);
  pSVar2 = Scope::find((Scope *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
  if (pSVar2 == (Symbol *)0x0) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_50);
    if (!bVar1) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffef0);
      sourceRange.endLoc = in_RDX;
      sourceRange.startLoc = in_RDI;
      Scope::addDiag(in_RSI,code,sourceRange);
      if ((local_29 & 1) == 0) {
        sv((char *)in_stack_fffffffffffffea0,(size_t)__t);
      }
      else {
        sv((char *)in_stack_fffffffffffffea0,(size_t)__t);
      }
      arg._M_len._4_4_ = in_stack_fffffffffffffeec;
      arg._M_len._0_4_ = in_stack_fffffffffffffee8;
      arg._M_str = (char *)in_stack_fffffffffffffef0;
      Diagnostic::operator<<(in_stack_fffffffffffffee0,arg);
      arg_00._M_len._4_4_ = in_stack_fffffffffffffeec;
      arg_00._M_len._0_4_ = in_stack_fffffffffffffee8;
      arg_00._M_str = (char *)in_stack_fffffffffffffef0;
      Diagnostic::operator<<(in_stack_fffffffffffffee0,arg_00);
    }
    std::optional<slang::ast::SubroutineSymbol_const*>::operator=(in_stack_fffffffffffffea0,__t);
    pDVar4 = &this->declaredReturnType;
    pTVar3 = Compilation::getErrorType(local_38);
    DeclaredType::setType(pDVar4,pTVar3);
  }
  else if (pSVar2->kind == Subroutine) {
    Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x46029d);
    std::optional<const_slang::ast::SubroutineSymbol_*>::
    optional<const_slang::ast::SubroutineSymbol_*,_true>(in_stack_fffffffffffffea0,__t);
    (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload =
         local_d8;
    *(undefined8 *)
     &(this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged =
         local_d0;
  }
  else {
    SVar5 = in_RDI;
    parsing::Token::range(in_stack_fffffffffffffec0);
    sourceRange_00.endLoc = in_RDX;
    sourceRange_00.startLoc = SVar5;
    Scope::addDiag(in_RSI,code,sourceRange_00);
    arg_01._M_len._4_4_ = in_stack_fffffffffffffeec;
    arg_01._M_len._0_4_ = in_stack_fffffffffffffee8;
    arg_01._M_str = (char *)(pSVar2->name)._M_len;
    Diagnostic::operator<<(in_stack_fffffffffffffee0,arg_01);
    Diagnostic::addNote((Diagnostic *)in_RDI,noteCode,in_stack_fffffffffffffea8);
    std::optional<slang::ast::SubroutineSymbol_const*>::operator=
              ((optional<const_slang::ast::SubroutineSymbol_*> *)in_RDI,__t);
    pDVar4 = &this->declaredReturnType;
    pTVar3 = Compilation::getErrorType(local_38);
    DeclaredType::setType(pDVar4,pTVar3);
  }
  return this;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::createForModport(const Scope& scope,
                                                               const SyntaxNode& syntax,
                                                               Token nameToken, bool isExport) {
    // Create the prototype symbol.
    auto& comp = scope.getCompilation();
    auto flags = isExport ? MethodFlags::ModportExport : MethodFlags::ModportImport;
    auto name = nameToken.valueText();
    auto result = comp.emplace<MethodPrototypeSymbol>(comp, name, nameToken.location(),
                                                      SubroutineKind::Function, Visibility::Public,
                                                      flags);
    result->setSyntax(syntax);

    // Find the target method we're importing or exporting from the parent interface.
    auto target = scope.find(name);
    if (!target) {
        if (!name.empty()) {
            auto& diag = scope.addDiag(diag::IfaceImportExportTarget, syntax.sourceRange());
            diag << (isExport ? "export"sv : "import"sv);
            diag << name;
        }

        result->subroutine = nullptr;
        result->declaredReturnType.setType(comp.getErrorType());
        return *result;
    }

    if (target->kind == SymbolKind::Subroutine) {
        result->subroutine = &target->as<SubroutineSymbol>();
    }
    else {
        auto& diag = scope.addDiag(diag::NotASubroutine, nameToken.range());
        diag << target->name;
        diag.addNote(diag::NoteDeclarationHere, target->location);

        result->subroutine = nullptr;
        result->declaredReturnType.setType(comp.getErrorType());
    }

    return *result;
}